

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

void google::protobuf::internal::ReflectionOps::FindInitializationErrors
               (Message *message,string *prefix,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *errors)

{
  bool bVar1;
  int iVar2;
  CppType CVar3;
  Descriptor *this;
  FieldDescriptor *this_00;
  size_type sVar4;
  string *in_RDX;
  Message *in_RSI;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *in_RDI;
  Message *sub_message_1;
  Message *sub_message;
  int j;
  int size;
  FieldDescriptor *field;
  int i_1;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  int i;
  Reflection *reflection;
  Descriptor *descriptor;
  value_type *in_stack_fffffffffffffea8;
  FieldDescriptor *in_stack_fffffffffffffeb0;
  FieldDescriptor *in_stack_fffffffffffffeb8;
  Reflection *in_stack_fffffffffffffec0;
  Reflection *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  int iVar5;
  Reflection *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  FieldDescriptor *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  string local_b8 [8];
  Message *in_stack_ffffffffffffff50;
  int local_90;
  int local_7c;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_78;
  string local_50 [36];
  int local_2c;
  Reflection *local_28;
  
  this = Message::GetDescriptor((Message *)in_stack_fffffffffffffeb0);
  local_28 = GetReflectionOrDie(in_stack_ffffffffffffff50);
  local_2c = 0;
  while (iVar5 = local_2c, iVar2 = Descriptor::field_count(this), iVar5 < iVar2) {
    Descriptor::field(this,local_2c);
    bVar1 = FieldDescriptor::is_required((FieldDescriptor *)0x430fe6);
    if (bVar1) {
      in_stack_ffffffffffffff10 = in_RDI;
      Descriptor::field(this,local_2c);
      bVar1 = Reflection::HasField
                        (in_stack_fffffffffffffec8,(Message *)in_stack_fffffffffffffec0,
                         in_stack_fffffffffffffeb8);
      if (!bVar1) {
        this_00 = Descriptor::field(this,local_2c);
        FieldDescriptor::name_abi_cxx11_(this_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        std::__cxx11::string::~string(local_50);
      }
    }
    local_2c = local_2c + 1;
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)0x4310f9);
  Reflection::ListFields
            (in_stack_ffffffffffffff20,(Message *)CONCAT44(iVar5,in_stack_ffffffffffffff18),
             in_stack_ffffffffffffff10);
  for (local_7c = 0;
      sVar4 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size(&local_78), (ulong)(long)local_7c < sVar4; local_7c = local_7c + 1) {
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::operator[](&local_78,(long)local_7c);
    CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x431178);
    if (CVar3 == CPPTYPE_MESSAGE) {
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x431198);
      in_stack_fffffffffffffed8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffed8);
      if (bVar1) {
        iVar2 = Reflection::FieldSize
                          ((Reflection *)
                           CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                           (Message *)in_stack_ffffffffffffff20,
                           (FieldDescriptor *)CONCAT44(iVar5,in_stack_ffffffffffffff18));
        in_stack_fffffffffffffed4 = iVar2;
        for (local_90 = 0; local_90 < iVar2; local_90 = local_90 + 1) {
          in_stack_fffffffffffffec0 =
               (Reflection *)
               Reflection::GetRepeatedMessage
                         (in_stack_fffffffffffffec8,(Message *)in_stack_fffffffffffffec0,
                          in_stack_fffffffffffffeb8,(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20))
          ;
          in_stack_fffffffffffffec8 = in_stack_fffffffffffffec0;
          SubMessagePrefix(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                           in_stack_ffffffffffffff2c);
          FindInitializationErrors
                    (in_RSI,in_RDX,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this);
          std::__cxx11::string::~string(local_b8);
        }
      }
      else {
        in_stack_fffffffffffffeb0 =
             (FieldDescriptor *)
             Reflection::GetMessage
                       ((Reflection *)CONCAT44(CVar3,in_stack_fffffffffffffed8),
                        (Message *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (FieldDescriptor *)in_stack_fffffffffffffec8,
                        (MessageFactory *)in_stack_fffffffffffffec0);
        in_stack_fffffffffffffeb8 = in_stack_fffffffffffffeb0;
        SubMessagePrefix(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                         in_stack_ffffffffffffff2c);
        FindInitializationErrors
                  (in_RSI,in_RDX,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
      }
    }
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)in_stack_fffffffffffffec0);
  return;
}

Assistant:

void ReflectionOps::FindInitializationErrors(const Message& message,
                                             const std::string& prefix,
                                             std::vector<std::string>* errors) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = GetReflectionOrDie(message);

  // Check required fields of this message.
  for (int i = 0; i < descriptor->field_count(); i++) {
    if (descriptor->field(i)->is_required()) {
      if (!reflection->HasField(message, descriptor->field(i))) {
        errors->push_back(prefix + descriptor->field(i)->name());
      }
    }
  }

  // Check sub-messages.
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {

      if (field->is_repeated()) {
        int size = reflection->FieldSize(message, field);

        for (int j = 0; j < size; j++) {
          const Message& sub_message =
              reflection->GetRepeatedMessage(message, field, j);
          FindInitializationErrors(sub_message,
                                   SubMessagePrefix(prefix, field, j), errors);
        }
      } else {
        const Message& sub_message = reflection->GetMessage(message, field);
        FindInitializationErrors(sub_message,
                                 SubMessagePrefix(prefix, field, -1), errors);
      }
    }
  }
}